

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-lstm.h
# Opt level: O2

void __thiscall cnn::FastLSTMBuilder::~FastLSTMBuilder(FastLSTMBuilder *this)

{
  ~FastLSTMBuilder(this);
  operator_delete(this);
  return;
}

Assistant:

FastLSTMBuilder() = default;